

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall cmGlobalNinjaGenerator::EncodeLiteral(cmGlobalNinjaGenerator *this,string *lit)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_b0;
  string local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(lit,"\n","$\n");
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])(this);
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])(this);
    local_90.field_2._M_allocated_capacity = (long)&local_90.field_2 + 8;
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = 1;
    local_90.field_2._M_local_buf[8] = '$';
    local_58.first._M_len = 1;
    local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58.first._M_str = (char *)local_90.field_2._M_allocated_capacity;
    local_40 = strlen((char *)CONCAT44(extraout_var,iVar1));
    local_30 = 0;
    views._M_len = 2;
    views._M_array = &local_58;
    local_38 = (char *)CONCAT44(extraout_var,iVar1);
    cmCatViews(&local_b0,views);
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x17])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)CONCAT44(extraout_var_00,iVar1),
               (allocator<char> *)&local_58);
    cmsys::SystemTools::ReplaceString(lit,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  return lit;
}

Assistant:

std::string& cmGlobalNinjaGenerator::EncodeLiteral(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
  return lit;
}